

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::FieldGeneratorMap::FieldGeneratorMap
          (FieldGeneratorMap *this,Descriptor *descriptor,Options *options)

{
  ulong uVar1;
  int iVar2;
  FieldGenerator *pFVar3;
  long *plVar4;
  scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator> *psVar5;
  FieldGenerator *pFVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  
  this->descriptor_ = descriptor;
  iVar2 = *(int *)(descriptor + 0x2c);
  lVar8 = (long)iVar2;
  uVar1 = lVar8 * 8;
  uVar7 = uVar1 + 8;
  if (0xfffffffffffffff7 < uVar1) {
    uVar7 = 0xffffffffffffffff;
  }
  if (lVar8 < 0) {
    uVar7 = 0xffffffffffffffff;
  }
  plVar4 = (long *)operator_new__(uVar7);
  *plVar4 = lVar8;
  if (lVar8 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator> *)(plVar4 + 1),0,
           uVar1);
  }
  (this->field_generators_).array_ =
       (scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator> *)(plVar4 + 1);
  iVar9 = *(int *)(descriptor + 0x78);
  lVar8 = (long)iVar9;
  uVar1 = lVar8 * 8;
  uVar7 = uVar1 + 8;
  if (0xfffffffffffffff7 < uVar1) {
    uVar7 = 0xffffffffffffffff;
  }
  if (lVar8 < 0) {
    uVar7 = 0xffffffffffffffff;
  }
  plVar4 = (long *)operator_new__(uVar7);
  *plVar4 = lVar8;
  if (iVar9 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator> *)(plVar4 + 1),0,
           uVar1);
  }
  (this->extension_generators_).array_ =
       (scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator> *)(plVar4 + 1);
  if (0 < iVar2) {
    lVar8 = 0;
    lVar10 = 0;
    do {
      psVar5 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>_>
               ::operator[](&this->field_generators_,lVar10);
      pFVar6 = FieldGenerator::Make
                         ((FieldDescriptor *)(*(long *)(descriptor + 0x30) + lVar8),options);
      pFVar3 = psVar5->ptr_;
      if (pFVar3 != pFVar6) {
        if (pFVar3 != (FieldGenerator *)0x0) {
          (*pFVar3->_vptr_FieldGenerator[1])();
        }
        psVar5->ptr_ = pFVar6;
      }
      lVar10 = lVar10 + 1;
      lVar8 = lVar8 + 0xa8;
    } while (lVar10 < *(int *)(descriptor + 0x2c));
    iVar9 = *(int *)(descriptor + 0x78);
  }
  if (0 < iVar9) {
    lVar8 = 0;
    lVar10 = 0;
    do {
      psVar5 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>_>
               ::operator[](&this->extension_generators_,lVar10);
      pFVar6 = FieldGenerator::Make
                         ((FieldDescriptor *)(*(long *)(descriptor + 0x80) + lVar8),options);
      pFVar3 = psVar5->ptr_;
      if (pFVar3 != pFVar6) {
        if (pFVar3 != (FieldGenerator *)0x0) {
          (*pFVar3->_vptr_FieldGenerator[1])();
        }
        psVar5->ptr_ = pFVar6;
      }
      lVar10 = lVar10 + 1;
      lVar8 = lVar8 + 0xa8;
    } while (lVar10 < *(int *)(descriptor + 0x78));
  }
  return;
}

Assistant:

FieldGeneratorMap::FieldGeneratorMap(const Descriptor* descriptor,
                                     const Options& options)
    : descriptor_(descriptor),
      field_generators_(
          new scoped_ptr<FieldGenerator>[descriptor->field_count()]),
      extension_generators_(
          new scoped_ptr<FieldGenerator>[descriptor->extension_count()]) {
  // Construct all the FieldGenerators.
  for (int i = 0; i < descriptor->field_count(); i++) {
    field_generators_[i].reset(
        FieldGenerator::Make(descriptor->field(i), options));
  }
  for (int i = 0; i < descriptor->extension_count(); i++) {
    extension_generators_[i].reset(
        FieldGenerator::Make(descriptor->extension(i), options));
  }
}